

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptFields.cpp
# Opt level: O2

void __thiscall
GlobOpt::UpdateObjectTypeValue
          (GlobOpt *this,Value *value,JITTypeHolder type,bool setType,EquivalentTypeSet *typeSet,
          bool setTypeSet)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JsTypeValueInfo *this_00;
  
  if (value->valueInfo != (ValueInfo *)0x0) {
    bVar2 = ValueInfo::IsJsType(value->valueInfo);
    if (bVar2) goto LAB_0046d135;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  *puVar3 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                     ,0x726,
                     "(value->GetValueInfo() != nullptr && value->GetValueInfo()->IsJsType())",
                     "value->GetValueInfo() != nullptr && value->GetValueInfo()->IsJsType()");
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  *puVar3 = 0;
LAB_0046d135:
  this_00 = ValueInfo::AsJsType(value->valueInfo);
  if (this_00->isShared == true) {
    this_00 = JsTypeValueInfo::Copy(this_00,this->alloc);
    ::Value::SetValueInfo(value,&this_00->super_ValueInfo);
  }
  if (setType) {
    JsTypeValueInfo::SetJsType(this_00,type);
  }
  if (setTypeSet) {
    JsTypeValueInfo::SetJsTypeSet(this_00,typeSet);
    return;
  }
  return;
}

Assistant:

void
GlobOpt::UpdateObjectTypeValue(Value* value, const JITTypeHolder type, bool setType, Js::EquivalentTypeSet* typeSet, bool setTypeSet)
{
    Assert(value->GetValueInfo() != nullptr && value->GetValueInfo()->IsJsType());
    JsTypeValueInfo* valueInfo = value->GetValueInfo()->AsJsType();

    if (valueInfo->GetIsShared())
    {
        valueInfo = valueInfo->Copy(this->alloc);
        value->SetValueInfo(valueInfo);
    }

    if (setType)
    {
        valueInfo->SetJsType(type);
    }
    if (setTypeSet)
    {
        valueInfo->SetJsTypeSet(typeSet);
    }
}